

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::RepeatedField
          (RepeatedField<double> *this,Arena *arena,RepeatedField<double> *rhs)

{
  bool is_soo_00;
  int new_size;
  double *src;
  double *dst;
  undefined1 local_29;
  bool is_soo;
  int size;
  bool rhs_is_soo;
  RepeatedField<double> *rhs_local;
  Arena *arena_local;
  RepeatedField<double> *this_local;
  
  internal::SooRep::SooRep(&this->soo_rep_,arena);
  AnnotateSize(this,1,0);
  is_soo_00 = RepeatedField<double>::is_soo(rhs);
  new_size = RepeatedField<double>::size(rhs,is_soo_00);
  if (new_size != 0) {
    if (1 < new_size) {
      Grow(this,true,0,new_size);
    }
    local_29 = 1 >= new_size;
    ExchangeCurrentSize(this,local_29,new_size);
    src = elements(rhs,is_soo_00);
    dst = unsafe_elements(this,local_29);
    UninitializedCopyN(src,new_size,dst);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(Arena* arena,
                                             const RepeatedField& rhs)
    : soo_rep_(arena) {
  StaticValidityCheck();
  AnnotateSize(kSooCapacityElements, 0);
  const bool rhs_is_soo = rhs.is_soo();
  if (auto size = rhs.size(rhs_is_soo)) {
    bool is_soo = true;
    if (size > kSooCapacityElements) {
      Grow(is_soo, 0, size);
      is_soo = false;
    }
    ExchangeCurrentSize(is_soo, size);
    UninitializedCopyN(rhs.elements(rhs_is_soo), size, unsafe_elements(is_soo));
  }
}